

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_benchmark.cpp
# Opt level: O2

void __thiscall tst_benchmark::valueFinally(tst_benchmark *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<Data>_> QVar2;
  undefined8 uVar3;
  bool bVar4;
  char cVar5;
  PromiseDataBase<void,_void_()> *pPVar6;
  PromiseData<Data> *pPVar7;
  QPromiseReject<Data> *in_R8;
  char *reject;
  int value;
  undefined4 uStack_214;
  PromiseResolver<Data> resolver_3;
  _Any_data local_208;
  undefined **local_1f8;
  PromiseData<Data> *local_1f0;
  PromiseResolver<Data> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data> local_1d8;
  QPromiseBase<Data> local_1d0;
  PromiseResolver<void> resolver_2;
  QPromiseBase<Data> local_1b0;
  QPromise<Data> p_1;
  int value_1;
  function<void_()> local_188;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data> local_160;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data> local_158;
  QArrayDataPointer<char16_t> local_150;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_138;
  QPromiseBase<Data> local_118;
  QPromise<Data> p;
  PromiseResolver<void> resolver;
  _Any_data local_b8 [2];
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  QPromiseBase<Data> local_50;
  QPromiseBase<Data> local_40;
  
  value = 0xffffffff;
  DAT_00120258 = 0;
  DAT_0012025c = 0;
  Logger::logs()::logs = 1;
  local_1d8.d._0_4_ = 0x2a;
  DAT_00120260 = Logger::logs()::logs;
  QtPromise::QPromise<Data>::resolve(&p_1,(Data_conflict *)&local_1d8);
  p.super_QPromiseBase<Data>.m_d = p_1.super_QPromiseBase<Data>.m_d;
  if (p_1.super_QPromiseBase<Data>.m_d.d != (PromiseData<Data> *)0x0) {
    LOCK();
    pQVar1 = &((p_1.super_QPromiseBase<Data>.m_d.d)->
              super_PromiseDataBase<Data,_void_(const_Data_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  p.super_QPromiseBase<Data>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011f9b8;
  local_138.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011f958;
  pPVar6 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  (pPVar6->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->m_catchers).d.size = 0;
  (pPVar6->m_handlers).d.size = 0;
  (pPVar6->m_catchers).d.d = (Data *)0x0;
  (pPVar6->m_handlers).d.d = (Data *)0x0;
  (pPVar6->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_Data_&)>_> *)0x0;
  *(undefined8 *)&(pPVar6->m_lock).field_0x0 = 0;
  *(undefined8 *)&pPVar6->m_settled = 0;
  ((PromiseDataBase<void,_void_()> *)&pPVar6->_vptr_PromiseDataBase)->_vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(pPVar6->super_QSharedData).ref = 0;
  (pPVar6->m_error).m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)pPVar6);
  LOCK();
  (pPVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pPVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar6 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    (pPVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (pPVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_188.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011fb28;
  local_188.super__Function_base._M_functor._8_8_ = pPVar6;
  local_138.super__Function_base._M_functor._8_8_ = pPVar6;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_188);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_188);
  QVar2 = p.super_QPromiseBase<Data>.m_d;
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_150.d = (Data *)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    local_208._8_8_ = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_208._8_8_ = resolver.m_d.d;
  }
  local_1d0._vptr_QPromiseBase = (_func_int **)0x0;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((Data *)local_208._8_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_208._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_208._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_208._M_unused._0_8_ = resolver.m_d.d;
  local_1f8 = (undefined **)&value;
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data>)local_208._8_8_;
  local_b8[0]._0_8_ = resolver.m_d.d;
  local_78._M_unused._M_object = operator_new(0x18);
  *(void **)local_78._M_unused._0_8_ = local_208._M_unused._M_object;
  if ((Data *)local_208._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_208._M_unused._0_8_ = *local_208._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_208._8_8_;
  if ((Data *)local_208._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_208._8_8_ = *(int *)local_208._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_78._M_unused._0_8_ + 0x10) = local_1f8;
  pcStack_60 = std::
               _Function_handler<void_(const_Data_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_Data_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseHandler<Data,tst_benchmark::valueFinally()::$_0,void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_benchmark::valueFinally()::$_0_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(Data_const&)#1}::~function((_lambda_Data_const___1_ *)local_208._M_pod_data);
  QtPromisePrivate::PromiseDataBase<Data,_void_(const_Data_&)>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<Data,_void_(const_Data_&)>,
             (function<void_(const_Data_&)> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  QVar2 = p.super_QPromiseBase<Data>.m_d;
  local_208._M_unused._M_object = (void *)local_b8[0]._0_8_;
  if ((Data *)local_b8[0]._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_b8[0]._0_8_ = *(int *)local_b8[0]._0_8_ + 1;
    UNLOCK();
  }
  local_208._8_8_ = resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_1f8 = (undefined **)&value;
  local_98._M_unused._M_object = operator_new(0x18);
  *(void **)local_98._M_unused._0_8_ = local_208._M_unused._M_object;
  if ((Data *)local_208._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_208._M_unused._0_8_ = *local_208._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_98._M_unused._0_8_ + 8) = local_208._8_8_;
  if ((Data *)local_208._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_208._8_8_ = *(int *)local_208._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_98._M_unused._0_8_ + 0x10) = local_1f8;
  pcStack_80 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseCatcher<Data,tst_benchmark::valueFinally()::$_0,void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_benchmark::valueFinally()::$_0_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
            ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)local_208._M_pod_data);
  QtPromisePrivate::PromiseDataBase<Data,_void_(const_Data_&)>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<Data,_void_(const_Data_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_98);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &resolver_1);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_1d0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)local_b8
            );
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_150);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  local_138.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011fb28;
  bVar4 = QtPromisePrivate::PromiseDataBase<Data,_void_(const_Data_&)>::isPending
                    (&(p.super_QPromiseBase<Data>.m_d.d)->
                      super_PromiseDataBase<Data,_void_(const_Data_&)>);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<Data,_void_(const_Data_&)>::dispatch
              (&(p.super_QPromiseBase<Data>.m_d.d)->super_PromiseDataBase<Data,_void_(const_Data_&)>
              );
  }
  local_150.ptr = (char16_t *)p.super_QPromiseBase<Data>.m_d.d;
  if (p.super_QPromiseBase<Data>.m_d.d != (PromiseData<Data> *)0x0) {
    LOCK();
    pQVar1 = &((p.super_QPromiseBase<Data>.m_d.d)->super_PromiseDataBase<Data,_void_(const_Data_&)>)
              .super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_150.d = (Data *)&PTR__QPromiseBase_0011f9b8;
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_0011f928;
  pPVar7 = (PromiseData<Data> *)operator_new(0x68);
  (pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar7->m_value).m_data.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_catchers.d.size = 0;
  (pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_handlers.d.size = 0;
  (pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_Data_&)>_> *)0x0;
  *(undefined8 *)&(pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_settled = 0;
  (pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>).super_QSharedData = 0;
  (pPVar7->m_value).m_data.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<Data>::PromiseData(pPVar7);
  LOCK();
  pQVar1 = &(pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar7 != (PromiseData<Data> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_188.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011f9b8;
  local_188.super__Function_base._M_functor._8_8_ = pPVar7;
  QtPromisePrivate::PromiseResolver<Data>::PromiseResolver(&resolver_1,(QPromise<Data> *)&local_188)
  ;
  QtPromise::QPromiseBase<Data>::~QPromiseBase((QPromiseBase<Data> *)&local_188);
  uVar3 = local_138.super__Function_base._M_functor._8_8_;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_208._M_unused._M_object = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_208._M_unused._0_8_ = (undefined8)resolver_1;
  }
  local_1b0._vptr_QPromiseBase = (_func_int **)0x0;
  if ((Data *)local_208._M_unused._0_8_ == (Data *)0x0) {
    local_208._8_8_ = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)local_208._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_208._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_208._8_8_ = local_208._M_unused._M_function_pointer;
  }
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data>)(Data *)0x0;
  if ((Data *)local_208._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_208._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_208._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((Data *)local_208._8_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_208._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_208._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_1f0 = (PromiseData<Data> *)local_150.ptr;
  if ((PromiseData<Data> *)local_150.ptr != (PromiseData<Data> *)0x0) {
    LOCK();
    pQVar1 = &((PromiseDataBase<Data,_void_(const_Data_&)> *)local_150.ptr)->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_1f8 = &PTR__QPromiseBase_0011f9b8;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  local_1d0._vptr_QPromiseBase = (_func_int **)local_208._M_unused._0_8_;
  local_118._vptr_QPromiseBase = (_func_int **)local_208._8_8_;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       operator_new(0x20);
  *(void **)resolver.m_d.d = local_208._M_unused._M_object;
  if ((Data *)local_208._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_208._M_unused._0_8_ = *local_208._M_unused._M_object + 1;
    UNLOCK();
  }
  ((Data *)resolver.m_d.d)->promise = (QPromise<void> *)local_208._8_8_;
  if ((Data *)local_208._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_208._8_8_ = *(int *)local_208._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_0011f928;
  ((Data *)((long)resolver.m_d.d + 0x10))->promise = (QPromise<void> *)local_1f0;
  if (local_1f0 != (PromiseData<Data> *)0x0) {
    LOCK();
    pQVar1 = &(local_1f0->super_PromiseDataBase<Data,_void_(const_Data_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_0011f9b8;
  QtPromisePrivate::
  PromiseHandler<void,QtPromise::QPromiseBase<Data>::finally<tst_benchmark::valueFinally()::$_0>(tst_benchmark::valueFinally()::$_0)const::{lambda()#1}()#1},void>
  ::
  create<QtPromise::QPromiseResolve<Data>,QtPromise::QPromiseReject<Data>>(QtPromise::QPromiseBase<Data>::finally<tst_benchmark::valueFinally()::$_0>(tst_benchmark::valueFinally()::$_0)const::{lambda()#1}()#1}const&,QtPromise::QPromiseResolve<Data>const&,QtPromise::QPromiseReject<Data>const&)
  ::{lambda()#1}::~function((_lambda___1_ *)local_208._M_pod_data);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            ((PromiseDataBase<void,_void_()> *)uVar3,(function<void_()> *)&resolver);
  std::_Function_base::~_Function_base((_Function_base *)&resolver);
  uVar3 = local_138.super__Function_base._M_functor._8_8_;
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<Data>,QtPromise::QPromiseReject<Data>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)local_b8,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_1d0,
             (QPromiseResolve<Data> *)&local_118,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            ((PromiseDataBase<void,_void_()> *)uVar3,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)local_b8);
  std::_Function_base::~_Function_base((_Function_base *)local_b8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data> *)
             &local_118);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_3.m_d);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data> *)
             &local_1d0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data> *)
             &local_1b0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_0011f9b8;
  bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    ((PromiseDataBase<void,_void_()> *)
                     local_138.super__Function_base._M_functor._8_8_);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              ((PromiseDataBase<void,_void_()> *)local_138.super__Function_base._M_functor._8_8_);
  }
  QtPromise::QPromiseBase<Data>::~QPromiseBase((QPromiseBase<Data> *)&local_150);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_138);
  QtPromise::QPromiseBase<Data>::~QPromiseBase(&p.super_QPromiseBase<Data>);
  QtPromise::QPromiseBase<Data>::wait(&local_40,&resolver_2);
  QtPromise::QPromiseBase<Data>::~QPromiseBase(&local_40);
  QtPromise::QPromiseBase<Data>::~QPromiseBase((QPromiseBase<Data> *)&resolver_2);
  QtPromise::QPromiseBase<Data>::~QPromiseBase(&p_1.super_QPromiseBase<Data>);
  DAT_00120260 = DAT_00120260 + -1;
  cVar5 = QTest::qCompare(Logger::logs()::logs,1,"Data::logs().ctor","1",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                          ,0xc9);
  if (cVar5 != '\0') {
    cVar5 = QTest::qCompare(DAT_00120258,0,"Data::logs().copy","0",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                            ,0xca);
    if (cVar5 != '\0') {
      cVar5 = QTest::qCompare(DAT_0012025c,1,"Data::logs().move","1",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                              ,0xcb);
      if (cVar5 != '\0') {
        cVar5 = QTest::qCompare(DAT_00120260,0,"Data::logs().refs","0",
                                "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                ,0xcc);
        if (cVar5 != '\0') {
          reject = 
          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
          ;
          cVar5 = QTest::qCompare(value,0x2a,"value","42",
                                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                  ,0xcd);
          if (cVar5 != '\0') {
            value_1 = -1;
            Logger::logs()::logs = 0;
            DAT_00120258 = 0;
            DAT_0012025c = 0;
            DAT_00120260 = 0;
            QString::QString((QString *)&local_150,"foo");
            QtPromise::QPromiseBase<Data>::reject<QString>(&local_118,(QString *)&local_150);
            p_1.super_QPromiseBase<Data>.m_d.d = local_118.m_d.d;
            if (local_118.m_d.d != (PromiseData<Data> *)0x0) {
              LOCK();
              pQVar1 = &((local_118.m_d.d)->super_PromiseDataBase<Data,_void_(const_Data_&)>).
                        super_QSharedData;
              (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i =
                   (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            p_1.super_QPromiseBase<Data>._vptr_QPromiseBase =
                 (_func_int **)&PTR__QPromiseBase_0011f9b8;
            resolver_1.m_d.d =
                 (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data>)
                 &PTR__QPromiseBase_0011f958;
            pPVar6 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
            (pPVar6->m_catchers).d.ptr =
                 (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>
                  *)0x0;
            (pPVar6->m_catchers).d.size = 0;
            (pPVar6->m_handlers).d.size = 0;
            (pPVar6->m_catchers).d.d = (Data *)0x0;
            (pPVar6->m_handlers).d.d = (Data *)0x0;
            (pPVar6->m_handlers).d.ptr =
                 (pair<QPointer<QThread>,_std::function<void_(const_Data_&)>_> *)0x0;
            *(undefined8 *)&pPVar6->m_lock = 0;
            *(undefined8 *)&pPVar6->m_settled = 0;
            pPVar6->_vptr_PromiseDataBase = (_func_int **)0x0;
            *(undefined8 *)&pPVar6->super_QSharedData = 0;
            (pPVar6->m_error).m_data._M_exception_object = (void *)0x0;
            QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)pPVar6);
            LOCK();
            (pPVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value.super___atomic_base<int> =
                 (__atomic_base<int>)
                 ((__int_type)
                  (pPVar6->super_QSharedData).ref.super_QAtomicInteger<int>.
                  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + 1);
            UNLOCK();
            if (pPVar6 != (PromiseDataBase<void,_void_()> *)0x0) {
              LOCK();
              (pPVar6->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
                   (__atomic_base<int>)
                   ((__int_type)
                    (pPVar6->super_QSharedData).ref.super_QAtomicInteger<int>.
                    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + 1);
              UNLOCK();
            }
            local_188.super__Function_base._M_functor._M_unused._M_object =
                 &PTR__QPromiseBase_0011fb28;
            local_188.super__Function_base._M_functor._8_8_ = pPVar6;
            QtPromisePrivate::PromiseResolver<void>::PromiseResolver
                      (&resolver_2,(QPromise<void> *)&local_188);
            QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_188);
            QVar2 = p_1.super_QPromiseBase<Data>.m_d;
            if (resolver_2.m_d.d == (Data *)0x0) {
              local_208._M_unused._M_object = (Data *)0x0;
            }
            else {
              LOCK();
              *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
              UNLOCK();
              local_208._M_unused._0_8_ = (undefined8)resolver_2;
            }
            resolver_3.m_d.d =
                 (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data>)
                 (Data *)0x0;
            if ((Data *)local_208._M_unused._0_8_ == (Data *)0x0) {
              _value = (Data *)0x0;
            }
            else {
              LOCK();
              (((Data *)local_208._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>
              .super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                   (((Data *)local_208._M_unused._0_8_)->super_QSharedData).ref.
                   super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
              _value = (Data *)local_208._M_unused._0_8_;
            }
            local_1d8.d = (Data *)0x0;
            if ((Data *)local_208._M_unused._0_8_ != (Data *)0x0) {
              LOCK();
              (((Data *)local_208._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>
              .super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                   (((Data *)local_208._M_unused._0_8_)->super_QSharedData).ref.
                   super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            if (_value != (Data *)0x0) {
              LOCK();
              (_value->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                   (_value->super_QSharedData).ref.super_QAtomicInteger<int>.
                   super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            p.super_QPromiseBase<Data>._vptr_QPromiseBase = (_func_int **)0x0;
            p.super_QPromiseBase<Data>.m_d.d = (PromiseData<Data> *)0x0;
            local_208._8_8_ = _value;
            local_1f8 = (undefined **)&value_1;
            local_1d0._vptr_QPromiseBase = (_func_int **)local_208._M_unused._0_8_;
            p.super_QPromiseBase<Data>._vptr_QPromiseBase = (_func_int **)operator_new(0x18);
            *p.super_QPromiseBase<Data>._vptr_QPromiseBase = (_func_int *)local_208._M_unused._0_8_;
            if ((Data *)local_208._M_unused._0_8_ != (Data *)0x0) {
              LOCK();
              *(int *)local_208._M_unused._0_8_ = *local_208._M_unused._M_object + 1;
              UNLOCK();
            }
            p.super_QPromiseBase<Data>._vptr_QPromiseBase[1] = (_func_int *)local_208._8_8_;
            if ((Data *)local_208._8_8_ != (Data *)0x0) {
              LOCK();
              *(int *)local_208._8_8_ = *(int *)local_208._8_8_ + 1;
              UNLOCK();
            }
            p.super_QPromiseBase<Data>._vptr_QPromiseBase[2] = (_func_int *)local_1f8;
            QtPromisePrivate::PromiseHandler<Data,tst_benchmark::valueFinally()::$_1,void>::
            create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_benchmark::valueFinally()::$_1_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
            ::{lambda(Data_const&)#1}::~function((_lambda_Data_const___1_ *)local_208._M_pod_data);
            QtPromisePrivate::PromiseDataBase<Data,_void_(const_Data_&)>::addHandler
                      (&(QVar2.d)->super_PromiseDataBase<Data,_void_(const_Data_&)>,
                       (function<void_(const_Data_&)> *)&p);
            std::_Function_base::~_Function_base((_Function_base *)&p);
            QVar2 = p_1.super_QPromiseBase<Data>.m_d;
            local_208._M_unused._M_object = local_1d0._vptr_QPromiseBase;
            if ((Data *)local_1d0._vptr_QPromiseBase != (Data *)0x0) {
              LOCK();
              (((QSharedData *)local_1d0._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                   (((QSharedData *)local_1d0._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
                   super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_208._8_8_ = _value;
            if (_value != (Data *)0x0) {
              LOCK();
              (_value->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                   (_value->super_QSharedData).ref.super_QAtomicInteger<int>.
                   super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_138.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
            local_138.super__Function_base._M_functor._8_8_ = 0;
            local_138.super__Function_base._M_manager = (_Manager_type)0x0;
            local_138._M_invoker = (_Invoker_type)0x0;
            local_1f8 = (undefined **)&value_1;
            local_138.super__Function_base._M_functor._M_unused._M_object = operator_new(0x18);
            *(void **)local_138.super__Function_base._M_functor._M_unused._0_8_ =
                 local_208._M_unused._M_object;
            if ((Data *)local_208._M_unused._0_8_ != (Data *)0x0) {
              LOCK();
              *(int *)local_208._M_unused._0_8_ = *local_208._M_unused._M_object + 1;
              UNLOCK();
            }
            *(undefined8 *)((long)local_138.super__Function_base._M_functor._M_unused._0_8_ + 8) =
                 local_208._8_8_;
            if ((Data *)local_208._8_8_ != (Data *)0x0) {
              LOCK();
              *(int *)local_208._8_8_ = *(int *)local_208._8_8_ + 1;
              UNLOCK();
            }
            *(undefined ***)((long)local_138.super__Function_base._M_functor._M_unused._0_8_ + 0x10)
                 = local_1f8;
            local_138._M_invoker =
                 std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
            local_138.super__Function_base._M_manager =
                 std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_manager;
            QtPromisePrivate::PromiseCatcher<Data,tst_benchmark::valueFinally()::$_1,void>::
            create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_benchmark::valueFinally()::$_1_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
            ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
                      ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)local_208._M_pod_data);
            QtPromisePrivate::PromiseDataBase<Data,_void_(const_Data_&)>::addCatcher
                      (&(QVar2.d)->super_PromiseDataBase<Data,_void_(const_Data_&)>,&local_138);
            std::_Function_base::~_Function_base(&local_138.super__Function_base);
            QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
            ~QExplicitlySharedDataPointer
                      ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>
                        *)&value);
            QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
            ~QExplicitlySharedDataPointer
                      ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>
                        *)&local_1d8);
            QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
            ~QExplicitlySharedDataPointer
                      ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>
                        *)&local_1d0);
            QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
            ~QExplicitlySharedDataPointer
                      ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>
                        *)&resolver_3);
            QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
            ~QExplicitlySharedDataPointer(&resolver_2.m_d);
            resolver_1.m_d.d =
                 (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data>)
                 &PTR__QPromiseBase_0011fb28;
            bVar4 = QtPromisePrivate::PromiseDataBase<Data,_void_(const_Data_&)>::isPending
                              (&(p_1.super_QPromiseBase<Data>.m_d.d)->
                                super_PromiseDataBase<Data,_void_(const_Data_&)>);
            if (!bVar4) {
              QtPromisePrivate::PromiseDataBase<Data,_void_(const_Data_&)>::dispatch
                        (&(p_1.super_QPromiseBase<Data>.m_d.d)->
                          super_PromiseDataBase<Data,_void_(const_Data_&)>);
            }
            local_1d0.m_d.d = p_1.super_QPromiseBase<Data>.m_d.d;
            if (p_1.super_QPromiseBase<Data>.m_d.d != (PromiseData<Data> *)0x0) {
              LOCK();
              pQVar1 = &((p_1.super_QPromiseBase<Data>.m_d.d)->
                        super_PromiseDataBase<Data,_void_(const_Data_&)>).super_QSharedData;
              (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i =
                   (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_1d0._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011f9b8;
            local_1b0._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011f928;
            pPVar7 = (PromiseData<Data> *)operator_new(0x68);
            (pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_error.m_data.
            _M_exception_object = (void *)0x0;
            (pPVar7->m_value).m_data.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_catchers.d.ptr =
                 (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>
                  *)0x0;
            (pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_catchers.d.size = 0;
            (pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_handlers.d.size = 0;
            (pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_catchers.d.d = (Data *)0x0;
            (pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_handlers.d.d = (Data *)0x0;
            (pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_handlers.d.ptr =
                 (pair<QPointer<QThread>,_std::function<void_(const_Data_&)>_> *)0x0;
            *(undefined8 *)&(pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_lock = 0;
            *(undefined8 *)&(pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_settled = 0
            ;
            (pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>)._vptr_PromiseDataBase =
                 (_func_int **)0x0;
            *(undefined8 *)
             &(pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>).super_QSharedData = 0;
            (pPVar7->m_value).m_data.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            QtPromisePrivate::PromiseData<Data>::PromiseData(pPVar7);
            LOCK();
            pQVar1 = &(pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>).super_QSharedData;
            (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i =
                 (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
            if (pPVar7 != (PromiseData<Data> *)0x0) {
              LOCK();
              pQVar1 = &(pPVar7->super_PromiseDataBase<Data,_void_(const_Data_&)>).super_QSharedData
              ;
              (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i =
                   (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            resolver_2.m_d.d =
                 (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
                 &PTR__QPromiseBase_0011f9b8;
            local_1b0.m_d.d = pPVar7;
            QtPromisePrivate::PromiseResolver<Data>::PromiseResolver
                      (&resolver_3,(QPromise<Data> *)&resolver_2);
            QtPromise::QPromiseBase<Data>::~QPromiseBase((QPromiseBase<Data> *)&resolver_2);
            if (resolver_3.m_d.d == (Data *)0x0) {
              _value = (Data *)0x0;
            }
            else {
              LOCK();
              *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
              UNLOCK();
              _value = resolver_3.m_d.d;
            }
            local_1d8.d = (Data *)0x0;
            if (_value == (Data *)0x0) {
              local_208._8_8_ = (Data *)0x0;
            }
            else {
              LOCK();
              (_value->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                   (_value->super_QSharedData).ref.super_QAtomicInteger<int>.
                   super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
              local_208._8_8_ = _value;
            }
            local_160.d = (Data *)0x0;
            if (_value != (Data *)0x0) {
              LOCK();
              (_value->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                   (_value->super_QSharedData).ref.super_QAtomicInteger<int>.
                   super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            if ((Data *)local_208._8_8_ != (Data *)0x0) {
              LOCK();
              (((Data *)local_208._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                   (((Data *)local_208._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
                   super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_1f0 = local_1d0.m_d.d;
            if (local_1d0.m_d.d != (PromiseData<Data> *)0x0) {
              LOCK();
              pQVar1 = &((local_1d0.m_d.d)->super_PromiseDataBase<Data,_void_(const_Data_&)>).
                        super_QSharedData;
              (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i =
                   (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_1f8 = &PTR__QPromiseBase_0011f9b8;
            local_188.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
            local_188.super__Function_base._M_functor._8_8_ = 0;
            local_188.super__Function_base._M_manager = (_Manager_type)0x0;
            local_188._M_invoker = (_Invoker_type)0x0;
            local_208._M_unused._0_8_ = (undefined8)_value;
            local_158.d = (Data *)local_208._8_8_;
            local_188.super__Function_base._M_functor._M_unused._M_object = operator_new(0x20);
            *(void **)local_188.super__Function_base._M_functor._M_unused._0_8_ =
                 local_208._M_unused._M_object;
            if ((Data *)local_208._M_unused._0_8_ != (Data *)0x0) {
              LOCK();
              *(int *)local_208._M_unused._0_8_ = *local_208._M_unused._M_object + 1;
              UNLOCK();
            }
            *(undefined8 *)((long)local_188.super__Function_base._M_functor._M_unused._0_8_ + 8) =
                 local_208._8_8_;
            if ((Data *)local_208._8_8_ != (Data *)0x0) {
              LOCK();
              *(int *)local_208._8_8_ = *(int *)local_208._8_8_ + 1;
              UNLOCK();
            }
            *(undefined ***)((long)local_188.super__Function_base._M_functor._M_unused._0_8_ + 0x10)
                 = &PTR__QPromiseBase_0011f928;
            *(PromiseData<Data> **)
             ((long)local_188.super__Function_base._M_functor._M_unused._0_8_ + 0x18) = local_1f0;
            if (local_1f0 != (PromiseData<Data> *)0x0) {
              LOCK();
              pQVar1 = &(local_1f0->super_PromiseDataBase<Data,_void_(const_Data_&)>).
                        super_QSharedData;
              (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i =
                   (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            *(undefined ***)((long)local_188.super__Function_base._M_functor._M_unused._0_8_ + 0x10)
                 = &PTR__QPromiseBase_0011f9b8;
            local_188._M_invoker =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
                 ::_M_invoke;
            local_188.super__Function_base._M_manager =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
                 ::_M_manager;
            QtPromisePrivate::
            PromiseHandler<void,QtPromise::QPromiseBase<Data>::finally<tst_benchmark::valueFinally()::$_1>(tst_benchmark::valueFinally()::$_1)const::{lambda()#1}()#1},void>
            ::
            create<QtPromise::QPromiseResolve<Data>,QtPromise::QPromiseReject<Data>>(QtPromise::QPromiseBase<Data>::finally<tst_benchmark::valueFinally()::$_1>(tst_benchmark::valueFinally()::$_1)const::{lambda()#1}()#1}const&,QtPromise::QPromiseResolve<Data>const&,QtPromise::QPromiseReject<Data>const&)
            ::{lambda()#1}::~function((_lambda___1_ *)local_208._M_pod_data);
            QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler(pPVar6,&local_188);
            std::_Function_base::~_Function_base(&local_188.super__Function_base);
            QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
            create<QtPromise::QPromiseResolve<Data>,QtPromise::QPromiseReject<Data>>
                      ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_208,
                       (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&value,
                       (QPromiseResolve<Data> *)&local_158,(QPromiseReject<Data> *)reject);
            QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
                      (pPVar6,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_208)
            ;
            std::_Function_base::~_Function_base((_Function_base *)&local_208);
            QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data>::
            ~QExplicitlySharedDataPointer(&local_158);
            QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data>::
            ~QExplicitlySharedDataPointer(&local_160);
            QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data>::
            ~QExplicitlySharedDataPointer
                      ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data>
                        *)&value);
            QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data>::
            ~QExplicitlySharedDataPointer(&local_1d8);
            QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data>::
            ~QExplicitlySharedDataPointer(&resolver_3.m_d);
            local_1b0._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011f9b8;
            bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(pPVar6);
            if (!bVar4) {
              QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch(pPVar6);
            }
            QtPromise::QPromiseBase<Data>::~QPromiseBase(&local_1d0);
            QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&resolver_1);
            QtPromise::QPromiseBase<Data>::~QPromiseBase(&p_1.super_QPromiseBase<Data>);
            QtPromise::QPromiseBase<Data>::wait(&local_50,&local_1b0);
            QtPromise::QPromiseBase<Data>::~QPromiseBase(&local_50);
            QtPromise::QPromiseBase<Data>::~QPromiseBase(&local_1b0);
            QtPromise::QPromiseBase<Data>::~QPromiseBase(&local_118);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_150);
            cVar5 = QTest::qCompare(Logger::logs()::logs,0,"Data::logs().ctor","0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                    ,0xd8);
            if (cVar5 != '\0') {
              cVar5 = QTest::qCompare(DAT_00120258,0,"Data::logs().copy","0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                      ,0xd9);
              if (cVar5 != '\0') {
                cVar5 = QTest::qCompare(DAT_0012025c,0,"Data::logs().move","0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                        ,0xda);
                if (cVar5 != '\0') {
                  cVar5 = QTest::qCompare(DAT_00120260,0,"Data::logs().refs","0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                          ,0xdb);
                  if (cVar5 != '\0') {
                    QTest::qCompare(value_1,0x2a,"value","42",
                                    "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                    ,0xdc);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void tst_benchmark::valueFinally()
{
    { // should not copy the value on continuation if fulfilled
        int value = -1;
        Data::logs().reset();
        QtPromise::QPromise<Data>::resolve(Data{42})
            .finally([&]() {
                value = 42;
            })
            .wait();

        QCOMPARE(Data::logs().ctor, 1);
        QCOMPARE(Data::logs().copy, 0);
        QCOMPARE(Data::logs().move, 1); // move value to the input and output promise data
        QCOMPARE(Data::logs().refs, 0);
        QCOMPARE(value, 42);
    }
    { // should not create value on continuation if rejected
        int value = -1;
        Data::logs().reset();
        QtPromise::QPromise<Data>::reject(QString{"foo"})
            .finally([&]() {
                value = 42;
            })
            .wait();

        QCOMPARE(Data::logs().ctor, 0);
        QCOMPARE(Data::logs().copy, 0);
        QCOMPARE(Data::logs().move, 0);
        QCOMPARE(Data::logs().refs, 0);
        QCOMPARE(value, 42);
    }
}